

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItemPrivate::updateAncestorFlags(QGraphicsItemPrivate *this)

{
  uint uVar1;
  ulong uVar2;
  
  if (this->parent == (QGraphicsItem *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar2 = *(ulong *)&((this->parent->d_ptr).d)->field_0x160;
    uVar1 = (uint)(uVar2 >> 0x20);
    uVar1 = uVar1 >> 0xf & 0x10 |
            uVar1 >> 3 & 6 | (uint)(uVar2 >> 0xd) & 1 |
            uVar1 >> 0x1a & 8 | (uint)(uVar2 >> 0x10) & 0x1f;
  }
  if ((((uint)(*(ulong *)&this->field_0x160 >> 0x10) & 0x1f) != uVar1) &&
     (*(ulong *)&this->field_0x160 =
           *(ulong *)&this->field_0x160 & 0xffffffffffe0ffff | (ulong)(uVar1 << 0x10),
     (this->children).d.size != 0)) {
    uVar2 = 0;
    do {
      updateAncestorFlags(((this->children).d.ptr[uVar2]->d_ptr).d);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)(this->children).d.size);
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::updateAncestorFlags()
{
    int flags = 0;
    if (parent) {
        // Inherit the parent's ancestor flags.
        QGraphicsItemPrivate *pd = parent->d_ptr.data();
        flags = pd->ancestorFlags;

        // Add in flags from the parent.
        if (pd->filtersDescendantEvents)
            flags |= AncestorFiltersChildEvents;
        if (pd->handlesChildEvents)
            flags |= AncestorHandlesChildEvents;
        if (pd->flags & QGraphicsItem::ItemClipsChildrenToShape)
            flags |= AncestorClipsChildren;
        if (pd->flags & QGraphicsItem::ItemIgnoresTransformations)
            flags |= AncestorIgnoresTransformations;
        if (pd->flags & QGraphicsItem::ItemContainsChildrenInShape)
            flags |= AncestorContainsChildren;
    }

    if (ancestorFlags == flags)
        return; // No change; stop propagation.
    ancestorFlags = flags;

    // Propagate to children recursively.
    for (int i = 0; i < children.size(); ++i)
        children.at(i)->d_ptr->updateAncestorFlags();
}